

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameters_tests.c
# Opt level: O2

void can_create_markers_for_mixed_parameters(void)

{
  byte bVar1;
  undefined1 uVar2;
  Constraint *constraint;
  byte *pbVar3;
  undefined8 uVar4;
  undefined1 *puVar5;
  int actual;
  undefined8 uVar6;
  
  uVar6 = create_vector_of_double_markers_for("a, box_double(b), c,d,box_double(e)");
  actual = cgreen_vector_size(uVar6);
  constraint = (Constraint *)create_equal_to_value_constraint(5,"5");
  cgreen::assert_that_<int>
            ("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/parameters_tests.c"
             ,0x93,"cgreen_vector_size(markers)",actual,constraint);
  pbVar3 = (byte *)cgreen_vector_get(uVar6,0);
  bVar1 = *pbVar3;
  uVar4 = create_is_true_constraint();
  assert_core_("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/parameters_tests.c"
               ,0x94,"!*(bool*)cgreen_vector_get(markers, 0)",bVar1 ^ 1,uVar4);
  puVar5 = (undefined1 *)cgreen_vector_get(uVar6,1);
  uVar2 = *puVar5;
  uVar4 = create_is_true_constraint();
  assert_core_("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/parameters_tests.c"
               ,0x95,"*(bool*)cgreen_vector_get(markers, 1)",uVar2,uVar4);
  pbVar3 = (byte *)cgreen_vector_get(uVar6,2);
  bVar1 = *pbVar3;
  uVar4 = create_is_true_constraint();
  assert_core_("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/parameters_tests.c"
               ,0x96,"!*(bool*)cgreen_vector_get(markers, 2)",bVar1 ^ 1,uVar4);
  pbVar3 = (byte *)cgreen_vector_get(uVar6,3);
  bVar1 = *pbVar3;
  uVar4 = create_is_true_constraint();
  assert_core_("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/parameters_tests.c"
               ,0x97,"!*(bool*)cgreen_vector_get(markers, 3)",bVar1 ^ 1,uVar4);
  puVar5 = (undefined1 *)cgreen_vector_get(uVar6,4);
  uVar2 = *puVar5;
  uVar4 = create_is_true_constraint();
  assert_core_("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/parameters_tests.c"
               ,0x98,"*(bool*)cgreen_vector_get(markers, 4)",uVar2,uVar4);
  destroy_cgreen_vector(uVar6);
  return;
}

Assistant:

Ensure(can_create_markers_for_mixed_parameters) {
    CgreenVector *markers = create_vector_of_double_markers_for("a, box_double(b), c,d,box_double(e)");
    assert_that(cgreen_vector_size(markers), is_equal_to(5));
    assert_that(!*(bool*)cgreen_vector_get(markers, 0));
    assert_that(*(bool*)cgreen_vector_get(markers, 1));
    assert_that(!*(bool*)cgreen_vector_get(markers, 2));
    assert_that(!*(bool*)cgreen_vector_get(markers, 3));
    assert_that(*(bool*)cgreen_vector_get(markers, 4));
    destroy_cgreen_vector(markers);
}